

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckySwapIJ.c
# Opt level: O2

void swap_ij(word *f,int totalVars,int varI,int varJ)

{
  int i;
  
  do {
    i = varI;
    varI = varJ;
    if (i == varI) {
      return;
    }
    varJ = i;
  } while (i != varI && varI <= i);
  if (varI < 6 && i < 5) {
    swap_ij_case1(f,totalVars,i,varI);
    return;
  }
  if (5 < varI && i < 6) {
    swap_ij_case2(f,totalVars,i,varI);
    return;
  }
  if (i < 6) {
    return;
  }
  swap_ij_case3(f,totalVars,i,varI);
  return;
}

Assistant:

void swap_ij( word* f,int totalVars, int varI, int varJ)
{
    if (varI == varJ)
        return;
    else if(varI>varJ)
        swap_ij( f,totalVars,varJ,varI);
    else if((varI <= 4) && (varJ <= 5))
        swap_ij_case1(f,totalVars, varI, varJ);
    else if((varI <= 5) && (varJ > 5))
        swap_ij_case2(f,totalVars, varI, varJ);
    else if((varI > 5) && (varJ > 5))
        swap_ij_case3(f,totalVars,varI,varJ);
}